

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::rc::TextureCube::TextureCube(TextureCube *this,deUint32 name)

{
  long lVar1;
  
  (this->super_Texture).super_NamedObject.m_name = name;
  *(undefined8 *)&(this->super_Texture).super_NamedObject.m_refCount = 0x200000001;
  (this->super_Texture).m_immutable = false;
  (this->super_Texture).m_sampler.wrapS = REPEAT_GL;
  (this->super_Texture).m_sampler.wrapT = REPEAT_GL;
  (this->super_Texture).m_sampler.wrapR = REPEAT_GL;
  (this->super_Texture).m_sampler.minFilter = NEAREST_MIPMAP_LINEAR;
  (this->super_Texture).m_sampler.magFilter = LINEAR;
  (this->super_Texture).m_sampler.lodThreshold = 0.0;
  (this->super_Texture).m_sampler.normalizedCoords = true;
  (this->super_Texture).m_sampler.compare = COMPAREMODE_NONE;
  (this->super_Texture).m_sampler.compareChannel = 0;
  *(undefined8 *)&(this->super_Texture).m_sampler.borderColor.v = 0;
  lVar1 = 0;
  *(undefined8 *)((long)&(this->super_Texture).m_sampler.borderColor.v + 8) = 0;
  (this->super_Texture).m_sampler.seamlessCubeMap = true;
  *(undefined8 *)&(this->super_Texture).m_sampler.depthStencilMode = 0;
  (this->super_Texture).m_maxLevel = 1000;
  (this->super_Texture).super_NamedObject._vptr_NamedObject =
       (_func_int **)&PTR__TextureCube_021c4a58;
  do {
    TextureLevelArray::TextureLevelArray
              ((TextureLevelArray *)((long)&this->m_levels[0].m_data[0].m_ptr + lVar1));
    lVar1 = lVar1 + 0x540;
  } while (lVar1 != 0x1f80);
  tcu::TextureCubeView::TextureCubeView(&this->m_view);
  return;
}

Assistant:

TextureCube::TextureCube (deUint32 name)
	: Texture(name, TYPE_CUBE_MAP)
{
}